

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O2

float64 vector_vqgen(float32 **data,int32 rows,int32 cols,int32 vqrows,float64 epsilon,int32 maxiter
                    ,float32 **mean,int32 *map,int32 seed)

{
  int *piVar1;
  size_t __n;
  int iVar2;
  int32 iVar3;
  void *pvVar4;
  long lVar5;
  ulong uVar6;
  float32 *mean_00;
  ulong uVar7;
  uint uVar8;
  unsigned_long s;
  ulong uVar9;
  ulong uVar10;
  double local_c0;
  double local_a0;
  float64 t;
  float64 local_70;
  ptmr_t tm;
  
  local_70 = epsilon;
  if ((((double)epsilon <= 0.0) || (rows < vqrows)) || (maxiter < 0)) {
    __assert_fail("(rows >= vqrows) && (maxiter >= 0) && (epsilon > 0.0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
                  ,0x191,
                  "float64 vector_vqgen(float32 **, int32, int32, int32, float64, int32, float32 **, int32 *, int32)"
                 );
  }
  pvVar4 = __ckd_calloc__((long)((rows + 0x1f) / 0x20),4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
                          ,0x193);
  ptmr_init(&tm);
  ptmr_start(&tm);
  if (seed < 0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
            ,0x19d,"You are using the internal mechanism of vector_vqgen to decide the seed.  \n");
    uVar10 = time((time_t *)0x0);
    s = uVar10 & 0xffffffff;
  }
  else {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
            ,0x1a7,"You are using %d as the seed \n",(ulong)(uint)seed);
    s = (unsigned_long)(uint)seed;
  }
  genrand_seed(s);
  __n = (long)cols * 4;
  uVar10 = 0;
  if (0 < vqrows) {
    uVar10 = (ulong)(uint)vqrows;
  }
  for (uVar6 = 0; uVar6 != uVar10; uVar6 = uVar6 + 1) {
    lVar5 = genrand_int31();
    uVar9 = (long)(ulong)((uint)lVar5 & 0x7fffffff) % (long)rows & 0xffffffff;
    while( true ) {
      uVar8 = *(uint *)((long)pvVar4 + (uVar9 >> 5) * 4);
      if ((uVar8 >> ((uint)uVar9 & 0x1f) & 1) == 0) break;
      uVar8 = (uint)uVar9 + 1;
      uVar9 = (ulong)uVar8;
      if (rows <= (int)uVar8) {
        uVar9 = 0;
      }
    }
    *(uint *)((long)pvVar4 + (uVar9 >> 5) * 4) = uVar8 | (uint)(1L << ((byte)uVar9 & 0x1f));
    memcpy(mean[uVar6],data[uVar9],__n);
  }
  ckd_free(pvVar4);
  pvVar4 = __ckd_calloc__((long)vqrows,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
                          ,0x1bf);
  mean_00 = (float32 *)
            __ckd_calloc__((long)cols,4,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
                           ,0x1c2);
  vector_mean(mean_00,mean,vqrows,cols);
  if (rows < 1) {
    rows = 0;
  }
  uVar6 = 0;
  if (0 < cols) {
    uVar6 = (ulong)(uint)cols;
  }
  uVar8 = 0;
  local_a0 = 0.0;
  do {
    local_c0 = 0.0;
    for (uVar9 = 0; (uint)rows != uVar9; uVar9 = uVar9 + 1) {
      iVar3 = vector_vqlabel(data[uVar9],mean,vqrows,cols,&t);
      map[uVar9] = iVar3;
      local_c0 = local_c0 + (double)t;
    }
    ptmr_stop(&tm);
    if (uVar8 == 0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
              ,0x1d0,"Iter %4d: %.1fs CPU; sqerr= %e\n",tm.t_cpu,local_c0,0);
      if (((local_c0 == 0.0) && (!NAN(local_c0))) || (maxiter + -1 < 1)) {
LAB_0011e3b7:
        ckd_free(pvVar4);
        ckd_free(mean_00);
        return (float64)local_c0;
      }
    }
    else {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
              ,0x1d3,"Iter %4d: %.1fs CPU; sqerr= %e; delta= %e\n",tm.t_cpu,local_c0,(ulong)uVar8);
      if (((local_c0 == 0.0) && (!NAN(local_c0))) ||
         ((maxiter + -1 <= (int)uVar8 || ((local_a0 - local_c0) / local_a0 < (double)local_70))))
      goto LAB_0011e3b7;
    }
    ptmr_start(&tm);
    for (uVar9 = 0; uVar9 != uVar10; uVar9 = uVar9 + 1) {
      for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        mean[uVar9][uVar7] = 0.0;
      }
      *(undefined4 *)((long)pvVar4 + uVar9 * 4) = 0;
    }
    for (uVar9 = 0; (uint)rows != uVar9; uVar9 = uVar9 + 1) {
      vector_accum(mean[map[uVar9]],data[uVar9],cols);
      piVar1 = (int *)((long)pvVar4 + (long)map[uVar9] * 4);
      *piVar1 = *piVar1 + 1;
    }
    for (uVar9 = 0; uVar9 != uVar10; uVar9 = uVar9 + 1) {
      iVar2 = *(int *)((long)pvVar4 + uVar9 * 4);
      if (iVar2 < 2) {
        if (iVar2 == 0) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
                  ,0x1ef,"Iter %d: mean[%d] unmapped\n",(ulong)uVar8,uVar9 & 0xffffffff);
          memcpy(mean[uVar9],mean_00,__n);
        }
      }
      else {
        t = (float64)(1.0 / (double)iVar2);
        for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
          mean[uVar9][uVar7] = (float32)(float)((double)(float)mean[uVar9][uVar7] * (double)t);
        }
      }
    }
    uVar8 = uVar8 + 1;
    local_a0 = local_c0;
  } while( true );
}

Assistant:

float64
vector_vqgen(float32 ** data, int32 rows, int32 cols, int32 vqrows,
             float64 epsilon, int32 maxiter,
             float32 ** mean, int32 * map, int32 seed)
{
    int32 i, j, r, it;
    float64 sqerr, prev_sqerr = 0, t;
    bitvec_t *sel;
    int32 *count;
    float32 *gmean;
    ptmr_t tm;

    assert((rows >= vqrows) && (maxiter >= 0) && (epsilon > 0.0));

    sel = bitvec_alloc(rows);

    ptmr_init(&tm);
    ptmr_start(&tm);


    /* Pick a random initial set of centroids */

    if (seed < 0) {
        E_INFO
            ("You are using the internal mechanism of vector_vqgen to decide the seed.  \n");
        s3_rand_seed((unsigned) time(NULL));

    }
    else {

        /*ARCHAN: DON'T delete this line! This will always give the
           experimenter the seed they were using in their experiments. This
           make the result be repeatable */

        E_INFO("You are using %d as the seed \n", seed);
        s3_rand_seed(seed);
    }


    for (i = 0; i < vqrows; i++) {
        /* Find r = a random, previously unselected row from the input */

        r = (s3_rand_int31() & (int32) 0x7fffffff) % rows;

        /*        r = (rand() & (int32)0x7fffffff) % rows; */

        while (bitvec_is_set(sel, r)) { /* BUG: possible infinite loop!! */
            if (++r >= rows)
                r = 0;
        }
        bitvec_set(sel, r);

        memcpy((void *) (mean[i]), (void *) (data[r]),
               cols * sizeof(float32));
        /* BUG: What if two randomly selected rows are identical in content?? */
    }
    bitvec_free(sel);

    count = (int32 *) ckd_calloc(vqrows, sizeof(int32));

    /* In k-means, unmapped means in any iteration are a problem.  Replace them with gmean */
    gmean = (float32 *) ckd_calloc(cols, sizeof(float32));
    vector_mean(gmean, mean, vqrows, cols);

    for (it = 0;; it++) {       /* Iterations of k-means algorithm */
        /* Find the current data->mean mappings (labels) */
        sqerr = 0.0;
        for (i = 0; i < rows; i++) {
            map[i] = vector_vqlabel(data[i], mean, vqrows, cols, &t);
            sqerr += t;
        }
        ptmr_stop(&tm);

        if (it == 0)
            E_INFO("Iter %4d: %.1fs CPU; sqerr= %e\n", it, tm.t_cpu,
                   sqerr);
        else
            E_INFO("Iter %4d: %.1fs CPU; sqerr= %e; delta= %e\n",
                   it, tm.t_cpu, sqerr, (prev_sqerr - sqerr) / prev_sqerr);

        /* Check if exit condition satisfied */
        if ((sqerr == 0.0) || (it >= maxiter - 1) ||
            ((it > 0) && (((prev_sqerr - sqerr) / prev_sqerr) < epsilon)))
            break;
        prev_sqerr = sqerr;

        ptmr_start(&tm);

        /* Update (reestimate) means */
        for (i = 0; i < vqrows; i++) {
            for (j = 0; j < cols; j++)
                mean[i][j] = 0.0;
            count[i] = 0;
        }
        for (i = 0; i < rows; i++) {
            vector_accum(mean[map[i]], data[i], cols);
            count[map[i]]++;
        }
        for (i = 0; i < vqrows; i++) {
            if (count[i] > 1) {
                t = 1.0 / (float64) (count[i]);
                for (j = 0; j < cols; j++)
                    /*              mean[i][j] *= t; *//* RAH, compiler was complaining about this,  */
                    mean[i][j] = (float32) ((float64) mean[i][j] * (float64) t);        /*  */
            }
            else if (count[i] == 0) {
                E_ERROR("Iter %d: mean[%d] unmapped\n", it, i);
                memcpy(mean[i], gmean, cols * sizeof(float32));
            }
        }
    }

    ckd_free(count);
    ckd_free(gmean);

    return sqerr;
}